

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict unary_expr(c2m_ctx_t c2m_ctx,int no_err_p)

{
  int iVar1;
  node_t_conflict pnVar2;
  node_t_conflict pnVar3;
  undefined1 local_48 [8];
  pos_t pos;
  node_code_t code;
  node_t_conflict t;
  node_t_conflict r;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  pnVar2 = try_f(c2m_ctx,par_type_name);
  if (pnVar2 == &err_struct) {
    iVar1 = match(c2m_ctx,0x132,(pos_t *)local_48,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar1 == 0) {
      iVar1 = match(c2m_ctx,0x112,(pos_t *)local_48,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar1 != 0) {
        pnVar2 = try_f(c2m_ctx,par_type_name);
        if (pnVar2 == &err_struct) {
          pnVar2 = unary_expr(c2m_ctx,no_err_p);
          if (pnVar2 == &err_struct) {
            return &err_struct;
          }
          pnVar2 = new_node(c2m_ctx,N_IGNORE);
          t = new_pos_node1(c2m_ctx,N_ALIGNOF,_local_48,pnVar2);
        }
        else {
          t = new_pos_node1(c2m_ctx,N_ALIGNOF,_local_48,pnVar2);
        }
        return t;
      }
      iVar1 = match(c2m_ctx,0x10c,(pos_t *)local_48,(node_code_t *)&pos.ln_pos,
                    (node_t_conflict *)0x0);
      if ((((iVar1 == 0) &&
           (iVar1 = match(c2m_ctx,0x10e,(pos_t *)local_48,(node_code_t *)&pos.ln_pos,
                          (node_t_conflict *)0x0), iVar1 == 0)) &&
          (iVar1 = match(c2m_ctx,0x106,(pos_t *)local_48,(node_code_t *)&pos.ln_pos,
                         (node_t_conflict *)0x0), iVar1 == 0)) &&
         ((iVar1 = match(c2m_ctx,0x2a,(pos_t *)local_48,(node_code_t *)&pos.ln_pos,
                         (node_t_conflict *)0x0), iVar1 == 0 &&
          (iVar1 = match(c2m_ctx,0x26,(pos_t *)local_48,(node_code_t *)&pos.ln_pos,
                         (node_t_conflict *)0x0), iVar1 == 0)))) {
        pnVar2 = post_expr(c2m_ctx,no_err_p);
        return pnVar2;
      }
      if (pos.ln_pos == 0x1e) {
        pos.ln_pos = 0x34;
      }
      else if (pos.ln_pos == 0x2c) {
        pos.ln_pos = 0x35;
      }
    }
    else {
      pnVar2 = try_f(c2m_ctx,par_type_name);
      if (pnVar2 != &err_struct) {
        pnVar2 = new_pos_node1(c2m_ctx,N_SIZEOF,_local_48,pnVar2);
        return pnVar2;
      }
      pos.ln_pos = 0x3e;
    }
    pnVar2 = unary_expr(c2m_ctx,no_err_p);
    if (pnVar2 == &err_struct) {
      return &err_struct;
    }
    pnVar2 = new_pos_node1(c2m_ctx,pos.ln_pos,_local_48,pnVar2);
    return pnVar2;
  }
  iVar1 = match(c2m_ctx,0x7b,(pos_t *)local_48,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar1 == 0) {
    pnVar3 = unary_expr(c2m_ctx,no_err_p);
    if (pnVar3 == &err_struct) {
      return &err_struct;
    }
    t = new_node2(c2m_ctx,N_CAST,pnVar2,pnVar3);
  }
  else {
    pnVar3 = initializer_list(c2m_ctx,no_err_p);
    if (pnVar3 == &err_struct) {
      return &err_struct;
    }
    iVar1 = match(c2m_ctx,0x7d,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar1 == 0) {
      c2m_ctx_local = (c2m_ctx_t)&err_struct;
      return (node_t_conflict)c2m_ctx_local;
    }
    pnVar2 = new_pos_node2(c2m_ctx,N_COMPOUND_LITERAL,_local_48,pnVar2,pnVar3);
    t = post_expr_part(c2m_ctx,no_err_p,pnVar2);
    if (t == &err_struct) {
      return t;
    }
  }
  return t;
}

Assistant:

D (unary_expr) {
  node_t r, t;
  node_code_t code;
  pos_t pos;

  if ((r = TRY (par_type_name)) != err_node) {
    t = r;
    if (!MP ('{', pos)) {
      P (unary_expr);
      r = new_node2 (c2m_ctx, N_CAST, t, r);
    } else {
      P (initializer_list);
      if (!M ('}')) return err_node;
      r = new_pos_node2 (c2m_ctx, N_COMPOUND_LITERAL, pos, t, r);
      PA (post_expr_part, r);
    }
    return r;
  } else if (MP (T_SIZEOF, pos)) {
    if ((r = TRY (par_type_name)) != err_node) {
      r = new_pos_node1 (c2m_ctx, N_SIZEOF, pos, r);
      return r;
    }
    code = N_EXPR_SIZEOF;
  } else if (MP (T_ALIGNOF, pos)) {
    if ((r = TRY (par_type_name)) != err_node) {
      r = new_pos_node1 (c2m_ctx, N_ALIGNOF, pos, r);
    } else {
      P (unary_expr); /* error recovery */
      r = new_pos_node1 (c2m_ctx, N_ALIGNOF, pos, new_node (c2m_ctx, N_IGNORE));
    }
    return r;
  } else if (!MC (T_INCDEC, pos, code) && !MC (T_UNOP, pos, code) && !MC (T_ADDOP, pos, code)
             && !MC ('*', pos, code) && !MC ('&', pos, code)) {
    P (post_expr);
    return r;
  } else if (code == N_AND) {
    code = N_ADDR;
  } else if (code == N_MUL) {
    code = N_DEREF;
  }
  P (unary_expr);
  r = new_pos_node1 (c2m_ctx, code, pos, r);
  return r;
}